

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

nng_err nng_aio_alloc(nng_aio **app,_func_void_void_ptr *cb,void *arg)

{
  nng_err nVar1;
  nni_aio *local_20;
  nng_aio *aio;
  
  nVar1 = nni_aio_alloc(&local_20,cb,arg);
  if (nVar1 == NNG_OK) {
    nni_aio_set_timeout(local_20,-2);
    *app = local_20;
  }
  return nVar1;
}

Assistant:

nng_err
nng_aio_alloc(nng_aio **app, void (*cb)(void *), void *arg)
{
	nng_aio *aio;
	nng_err  rv;

	if ((rv = nni_aio_alloc(&aio, (nni_cb) cb, arg)) == 0) {
		nng_aio_set_timeout(aio, NNG_DURATION_DEFAULT);
		*app = aio;
	}
	return (rv);
}